

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O2

void __thiscall
InterpreterTestSuite_MNI_MultiEntryImportImplicitNetworkPass_Test::TestBody
          (InterpreterTestSuite_MNI_MultiEntryImportImplicitNetworkPass_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__return_storage_ptr__;
  Registry *pRVar1;
  Status SVar2;
  bool bVar3;
  CommissionerAppMock *this_00;
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *this_01;
  TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
  *this_02;
  string *this_03;
  char *pcVar4;
  _func_int **pp_Var5;
  initializer_list<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>
  __l;
  Status local_551;
  allocator local_550;
  allocator local_54f;
  allocator local_54e;
  allocator local_54d;
  allocator local_54c;
  allocator local_54b;
  allocator local_54a;
  allocator local_549;
  AssertionResult gtest_ar_;
  CommissionerAppMockPtr commissionerAppMock;
  Value value;
  undefined1 local_4d0 [72];
  _Any_data local_488;
  long local_478;
  undefined8 uStack_470;
  _Any_data local_468;
  code *local_458;
  code *pcStack_450;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_448;
  MatcherBase<const_ot::commissioner::Config_&> local_428;
  Expression expr;
  State local_3e0;
  State local_3dc;
  _Any_data local_3d8;
  code *local_3c8;
  code *pcStack_3c0;
  __shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2> local_3b8;
  string local_3a8;
  UnixTime local_388;
  UnixTime local_380;
  string mepdsFileName;
  string multiEntryPendingDataset;
  BorderRouter br;
  undefined1 local_1b0 [8];
  _Alloc_hider local_1a8;
  size_type local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined1 local_188 [8];
  _Alloc_hider local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  std::__cxx11::string::string
            ((string *)&multiEntryPendingDataset,
             "\n{\n  \"1122334455667788\":\n  {\n    \"DelayTimer\": 60000, // in milliseconds\n    \"PendingTimestamp\": {\n        \"Seconds\": 58, // 48 bits\n        \"Ticks\": 48, // 15 bits\n        \"U\": 0 // 1 bit\n    },\n    \"ActiveTimestamp\": {\n        \"Seconds\": 58, // 48 bits\n        \"Ticks\": 48, // 15 bits\n        \"U\": 0 // 1 bit\n    },\n    \"ExtendedPanId\": \"1122334455667788\",\n    \"NetworkName\": \"net1\",\n    \"SecurityPolicy\": {\n        \"Flags\": \"ff\",\n        \"RotationTime\": 673\n    }\n  },\n  \"99AABBCCDDEEFF00\":\n  {\n    \"DelayTimer\": 60000, // in milliseconds\n    \"PendingTimestamp\": {\n        \"Seconds\": 58, // 48 bits\n        \"Ticks\": 48, // 15 bits\n        \"U\": 0 // 1 bit\n    },\n    \"ActiveTimestamp\": {\n        \"Seconds\": 58, // 48 bits\n        \"Ticks\": 48, // 15 bits\n        \"U\": 0 // 1 bit\n    },\n    \"ExtendedPanId\": \"99AABBCCDDEEFF00\",\n    \"NetworkName\": \"net9\",\n    \"SecurityPolicy\": {\n        \"Flags\": \"ff\",\n        \"RotationTime\": 673\n    }\n  }\n}"
             ,(allocator *)&br);
  std::__cxx11::string::string((string *)&mepdsFileName,"./mepds.json",(allocator *)&br);
  ot::commissioner::WriteFile((Error *)&br,&multiEntryPendingDataset,&mepdsFileName);
  local_4d0._0_4_ = (ErrorCode)br._vptr_BorderRouter;
  gtest_ar_._0_8_ = (ulong)(uint)gtest_ar_._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
            ((internal *)&value,"WriteFile(multiEntryPendingDataset, mepdsFileName).GetCode()",
             "ErrorCode::kNone",(ErrorCode *)local_4d0,(ErrorCode *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&br.mId);
  if ((undefined1)value.mError.mCode == kNone) {
    testing::Message::Message((Message *)&br);
    if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)value.mError.mMessage._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_4d0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0xbfa,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_4d0,(Message *)&br);
    this_03 = &value.mError.mMessage;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4d0);
    if ((long *)CONCAT44(br._vptr_BorderRouter._4_4_,(ErrorCode)br._vptr_BorderRouter) !=
        (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(br._vptr_BorderRouter._4_4_,(ErrorCode)br._vptr_BorderRouter) +
                  8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&value.mError.mMessage);
    value.mError.mCode = kNone;
    value.mError._4_4_ = 0;
    testing::internal::
    CmpHelperNE<ot::commissioner::persistent_storage::Registry*,decltype(nullptr)>
              ((internal *)&br,"ctx.mRegistry","nullptr",&ctx.mRegistry,(void **)&value);
    if ((char)br._vptr_BorderRouter == '\0') {
      testing::Message::Message((Message *)&value);
      if ((undefined8 *)CONCAT44(br.mNetworkId.mId,br.mId.mId) == (undefined8 *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)CONCAT44(br.mNetworkId.mId,br.mId.mId);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_4d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0xbfc,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_4d0,(Message *)&value);
      this_03 = (string *)&br.mId;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4d0);
      if (value.mError._0_8_ != 0) {
        (**(code **)(*(long *)value.mError._0_8_ + 8))();
      }
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&br.mId);
      pRVar1 = ctx.mRegistry;
      std::__cxx11::string::string((string *)&value,"127.0.0.1",&local_549);
      local_428._vptr_MatcherBase = (_func_int **)0x0;
      local_428.impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_428.impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__cxx11::string::string((string *)local_4d0,"1.1",&local_54a);
      ot::commissioner::BorderAgent::State::State(&local_3dc,0,0,0,0,0);
      std::__cxx11::string::string((string *)&gtest_ar_,"net1",&local_54b);
      std::__cxx11::string::string((string *)&expr,"",&local_54c);
      std::__cxx11::string::string((string *)local_488._M_pod_data,"",&local_54d);
      std::__cxx11::string::string((string *)local_468._M_pod_data,"",&local_54e);
      local_448._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_448._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_448._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)local_3d8._M_pod_data,"domain1",&local_54f);
      pp_Var5 = (_func_int **)0x2973f5;
      std::__cxx11::string::string((string *)&local_3a8,"",&local_550);
      ot::commissioner::UnixTime::UnixTime(&local_380,0);
      ot::commissioner::BorderAgent::BorderAgent
                ((BorderAgent *)&br,(string *)&value,0x4e21,(ByteArray *)&local_428,
                 (string *)local_4d0,local_3dc,(string *)&gtest_ar_,0x1122334455667788,
                 (string *)&expr,(string *)&local_488,(Timestamp)0x0,0,(string *)&local_468,
                 (ByteArray *)&local_448,(string *)&local_3d8,'\0',0,&local_3a8,local_380,0x101f);
      local_3b8._M_ptr._0_1_ =
           ot::commissioner::persistent_storage::Registry::Add(pRVar1,(BorderAgent *)&br);
      local_551 = kSuccess;
      testing::internal::
      CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                ((internal *)&commissionerAppMock,
                 "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 0x1122334455667788ul, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
                 ,"RegistryStatus::kSuccess",(Status *)&local_3b8,&local_551);
      ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::__cxx11::string::~string((string *)local_3d8._M_pod_data);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_448);
      std::__cxx11::string::~string((string *)local_468._M_pod_data);
      std::__cxx11::string::~string((string *)local_488._M_pod_data);
      std::__cxx11::string::~string((string *)&expr);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      std::__cxx11::string::~string((string *)local_4d0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_428);
      std::__cxx11::string::~string((string *)&value);
      if ((char)commissionerAppMock.
                super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr == '\0')
      {
        testing::Message::Message((Message *)&br);
        if (commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          pp_Var5 = (commissionerAppMock.
                     super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi)->_vptr__Sp_counted_base;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&value,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0xc00,(char *)pp_Var5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&br);
        this_03 = (string *)
                  &commissionerAppMock.
                   super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
        if ((long *)CONCAT44(br._vptr_BorderRouter._4_4_,(ErrorCode)br._vptr_BorderRouter) !=
            (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(br._vptr_BorderRouter._4_4_,
                                         (ErrorCode)br._vptr_BorderRouter) + 8))();
        }
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&commissionerAppMock.
                          super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
        pRVar1 = ctx.mRegistry;
        std::__cxx11::string::string((string *)&value,"127.0.0.2",&local_549);
        local_428._vptr_MatcherBase = (_func_int **)0x0;
        local_428.impl_.
        super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_428.impl_.
        super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::__cxx11::string::string((string *)local_4d0,"1.1",&local_54a);
        ot::commissioner::BorderAgent::State::State(&local_3e0,0,0,0,0,0);
        std::__cxx11::string::string((string *)&gtest_ar_,"net2",&local_54b);
        std::__cxx11::string::string((string *)&expr,"",&local_54c);
        std::__cxx11::string::string((string *)local_488._M_pod_data,"",&local_54d);
        std::__cxx11::string::string((string *)local_468._M_pod_data,"",&local_54e);
        local_448._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_448._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_448._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string((string *)local_3d8._M_pod_data,"domain2",&local_54f);
        pp_Var5 = (_func_int **)0x2973f5;
        std::__cxx11::string::string((string *)&local_3a8,"",&local_550);
        ot::commissioner::UnixTime::UnixTime(&local_388,0);
        pcVar4 = (char *)(ulong)(uint)local_3e0;
        ot::commissioner::BorderAgent::BorderAgent
                  ((BorderAgent *)&br,(string *)&value,0x4e22,(ByteArray *)&local_428,
                   (string *)local_4d0,local_3e0,(string *)&gtest_ar_,0x99aabbccddeeff00,
                   (string *)&expr,(string *)&local_488,(Timestamp)0x0,0,(string *)&local_468,
                   (ByteArray *)&local_448,(string *)&local_3d8,'\0',0,&local_3a8,local_388,0x101f);
        local_3b8._M_ptr._0_1_ =
             ot::commissioner::persistent_storage::Registry::Add(pRVar1,(BorderAgent *)&br);
        local_551 = kSuccess;
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                  ((internal *)&commissionerAppMock,
                   "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20002, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 0x99AABBCCDDEEFF00ul, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain2\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
                   ,"RegistryStatus::kSuccess",(Status *)&local_3b8,&local_551);
        ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&br);
        std::__cxx11::string::~string((string *)&local_3a8);
        std::__cxx11::string::~string((string *)local_3d8._M_pod_data);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_448);
        std::__cxx11::string::~string((string *)local_468._M_pod_data);
        std::__cxx11::string::~string((string *)local_488._M_pod_data);
        std::__cxx11::string::~string((string *)&expr);
        std::__cxx11::string::~string((string *)&gtest_ar_);
        std::__cxx11::string::~string((string *)local_4d0);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_428);
        std::__cxx11::string::~string((string *)&value);
        if ((char)commissionerAppMock.
                  super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr != '\0'
           ) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&commissionerAppMock.
                            super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
          ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&br);
          ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)&value,0);
          br.mNetworkId.mId = value.mError.mCode;
          SVar2 = ot::commissioner::persistent_storage::Registry::SetCurrentNetwork
                            (ctx.mRegistry,&br);
          local_4d0[0] = SVar2;
          gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffffffffff00;
          testing::internal::
          CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                    ((internal *)&value,"ctx.mRegistry->SetCurrentNetwork(br)",
                     "RegistryStatus::kSuccess",local_4d0,&gtest_ar_.success_);
          if ((undefined1)value.mError.mCode == kNone) {
            testing::Message::Message((Message *)local_4d0);
            if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = *(char **)value.mError.mMessage._M_dataplus._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0xc07,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_,(Message *)local_4d0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
            if ((long *)CONCAT44(local_4d0._4_4_,local_4d0._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_4d0._4_4_,local_4d0._0_4_) + 8))();
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&value.mError.mMessage);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&value.mError.mMessage);
            this_00 = (CommissionerAppMock *)operator_new(0x1838);
            memset(this_00,0,0x1838);
            CommissionerAppMock::CommissionerAppMock(this_00);
            std::__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<CommissionerAppMock,void>
                      ((__shared_ptr<CommissionerAppMock,(__gnu_cxx::_Lock_policy)2> *)
                       &commissionerAppMock,this_00);
            testing::A<std::shared_ptr<ot::commissioner::CommissionerApp>&>();
            testing::A<ot::commissioner::Config_const&>();
            CommissionerAppStaticExpecter::gmock_Create
                      ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                        *)local_4d0,&ctx.mCommissionerAppStaticExpecter,
                       (Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)&local_3a8,
                       (Matcher<const_ot::commissioner::Config_&> *)&local_428);
            testing::internal::GetWithoutMatchers();
            this_01 = testing::internal::
                      MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                      ::InternalExpectedAt
                                ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                                  *)local_4d0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                                 ,0xc0a,"ctx.mCommissionerAppStaticExpecter","Create(_, _)");
            local_188._0_4_ = kNone;
            local_180._M_p = (pointer)&local_170;
            local_178 = 0;
            local_170._M_local_buf[0] = '\0';
            testing::Return<ot::commissioner::Error>((testing *)&local_3b8,(Error *)local_188);
            std::__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2> *)
                       &local_448,&local_3b8);
            expr.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            gtest_ar_.success_ = false;
            gtest_ar_._1_7_ = 0;
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            expr.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)std::
                          _Function_handler<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:3084:30)>
                          ::_M_manager;
            local_448._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)&commissionerAppMock;
            expr.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)&commissionerAppMock;
            std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
            std::function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)>::function
                      ((function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)
                       &local_488,
                       (function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)
                       &expr);
            local_458 = (code *)0x0;
            pcStack_450 = (code *)0x0;
            local_468._M_unused._M_object = (void *)0x0;
            local_468._8_8_ = 0;
            gtest_ar_.success_ = false;
            gtest_ar_._1_7_ = 0;
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            local_468._M_unused._M_object = operator_new(0x20);
            *(undefined8 *)local_468._M_unused._0_8_ = 0;
            *(undefined8 *)((long)local_468._M_unused._0_8_ + 8) = 0;
            *(undefined8 *)((long)local_468._M_unused._0_8_ + 0x10) = 0;
            *(undefined8 *)((long)local_468._M_unused._0_8_ + 0x18) = uStack_470;
            if (local_478 != 0) {
              *(void **)local_468._M_unused._0_8_ = local_488._M_unused._M_object;
              *(undefined8 *)((long)local_468._M_unused._0_8_ + 8) = local_488._8_8_;
              *(long *)((long)local_468._M_unused._0_8_ + 0x10) = local_478;
              local_478 = 0;
              uStack_470 = 0;
            }
            local_468._8_8_ =
                 gtest_ar_.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
            gtest_ar_.success_ = false;
            gtest_ar_._1_7_ = 0;
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            local_458 = std::_Function_handler::operator_cast_to_Action;
            pcStack_450 = std::_Function_handler::operator_cast_to_Action;
            std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
            std::_Function_base::~_Function_base((_Function_base *)&local_488);
            std::_Function_base::~_Function_base((_Function_base *)&expr);
            __l._M_len = 1;
            __l._M_array = (iterator)&local_468;
            std::
            vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
            ::vector((vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
                      *)&value,__l,(allocator_type *)&gtest_ar_);
            std::_Function_base::~_Function_base((_Function_base *)&local_468);
            __return_storage_ptr__ = &value.mError.mMessage.field_2;
            testing::internal::ReturnAction::operator_cast_to_Action
                      ((Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                        *)__return_storage_ptr__,(ReturnAction *)&local_448);
            local_3c8 = (code *)0x0;
            pcStack_3c0 = (code *)0x0;
            local_3d8._M_unused._M_object = (void *)0x0;
            local_3d8._8_8_ = 0;
            gtest_ar_.success_ = false;
            gtest_ar_._1_7_ = 0;
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            local_3d8._M_unused._M_object = operator_new(0x38);
            *(undefined8 *)local_3d8._M_unused._0_8_ = value.mError._0_8_;
            *(pointer *)((long)local_3d8._M_unused._0_8_ + 8) =
                 value.mError.mMessage._M_dataplus._M_p;
            *(size_type *)((long)local_3d8._M_unused._0_8_ + 0x10) =
                 value.mError.mMessage._M_string_length;
            value.mError.mCode = kNone;
            value.mError._4_4_ = 0;
            value.mError.mMessage._M_dataplus._M_p = (pointer)0x0;
            value.mError.mMessage._M_string_length = 0;
            *(undefined8 *)((long)local_3d8._M_unused._0_8_ + 0x18) = 0;
            *(undefined8 *)((long)local_3d8._M_unused._0_8_ + 0x20) = 0;
            *(undefined8 *)((long)local_3d8._M_unused._0_8_ + 0x28) = 0;
            *(size_type *)((long)local_3d8._M_unused._0_8_ + 0x30) = value.mData._M_string_length;
            if (value.mData._M_dataplus._M_p != (pointer)0x0) {
              *(ulong *)((long)local_3d8._M_unused._0_8_ + 0x18) =
                   CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                            value.mError.mMessage.field_2._M_local_buf[0]);
              *(undefined8 *)((long)local_3d8._M_unused._0_8_ + 0x20) =
                   value.mError.mMessage.field_2._8_8_;
              *(pointer *)((long)local_3d8._M_unused._0_8_ + 0x28) = value.mData._M_dataplus._M_p;
              value.mData._M_dataplus._M_p = (pointer)0x0;
              value.mData._M_string_length = 0;
            }
            local_3d8._8_8_ =
                 gtest_ar_.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
            gtest_ar_.success_ = false;
            gtest_ar_._1_7_ = 0;
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            local_3c8 = std::_Function_handler::operator_cast_to_Action;
            pcStack_3c0 = std::_Function_handler::operator_cast_to_Action;
            std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
            anon_func::Op::~Op((Op *)&value);
            testing::internal::
            TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
            ::WillOnce(this_01,(Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                                *)&local_3d8);
            std::_Function_base::~_Function_base((_Function_base *)&local_3d8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &local_448._M_impl.super__Vector_impl_data._M_finish);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3b8._M_refcount)
            ;
            std::__cxx11::string::~string((string *)&local_180);
            std::
            _Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
            ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>,_testing::Matcher<const_ot::commissioner::Config_&>_>
                            *)(local_4d0 + 8));
            testing::internal::MatcherBase<const_ot::commissioner::Config_&>::~MatcherBase
                      (&local_428);
            testing::internal::MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&>::
            ~MatcherBase((MatcherBase<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)
                         &local_3a8);
            testing::A<ot::commissioner::ActiveOperationalDataset_const&>();
            CommissionerAppMock::gmock_SetActiveDataset
                      ((MockSpec<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
                        *)&value,
                       (CommissionerAppMock *)
                       CONCAT71(commissionerAppMock.
                                super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr._1_7_,
                                (char)commissionerAppMock.
                                      super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr),
                       (Matcher<const_ot::commissioner::ActiveOperationalDataset_&> *)&gtest_ar_);
            testing::internal::GetWithoutMatchers();
            this_02 = testing::internal::
                      MockSpec<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
                      ::InternalExpectedAt
                                ((MockSpec<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
                                  *)&value,
                                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                                 ,0xc0d,"*commissionerAppMock","SetActiveDataset(_)");
            local_1b0._0_4_ = kNone;
            local_1a8._M_p = (pointer)&local_198;
            local_1a0 = 0;
            local_198._M_local_buf[0] = '\0';
            testing::Return<ot::commissioner::Error>((testing *)&expr,(Error *)local_1b0);
            testing::internal::ReturnAction::operator_cast_to_Action
                      ((Action<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
                        *)local_4d0,(ReturnAction *)&expr);
            testing::internal::
            TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
            ::WillOnce(this_02,(Action<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
                                *)local_4d0);
            std::_Function_base::~_Function_base((_Function_base *)local_4d0);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &expr.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
            std::__cxx11::string::~string((string *)&local_1a8);
            testing::internal::MatcherBase<const_ot::commissioner::ActiveOperationalDataset_&>::
            ~MatcherBase((MatcherBase<const_ot::commissioner::ActiveOperationalDataset_&> *)
                         &value.mError.mMessage);
            testing::internal::MatcherBase<const_ot::commissioner::ActiveOperationalDataset_&>::
            ~MatcherBase((MatcherBase<const_ot::commissioner::ActiveOperationalDataset_&> *)
                         &gtest_ar_);
            expr.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            expr.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            expr.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            value.mError._0_8_ = value.mError._0_8_ & 0xffffffff00000000;
            value.mError.mMessage._M_string_length = 0;
            value.mError.mMessage.field_2._M_local_buf[0] = '\0';
            value.mData._M_dataplus._M_p = (pointer)&value.mData.field_2;
            value.mData._M_string_length = 0;
            value.mData.field_2._M_local_buf[0] = '\0';
            value.mError.mMessage._M_dataplus._M_p = (pointer)__return_storage_ptr__;
            std::__cxx11::string::string
                      ((string *)local_4d0,"start",(allocator *)local_488._M_pod_data);
            ot::commissioner::Interpreter::ParseExpression
                      ((Expression *)&gtest_ar_,&ctx.mInterpreter,(string *)local_4d0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_move_assign(&expr,&gtest_ar_);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gtest_ar_);
            std::__cxx11::string::~string((string *)local_4d0);
            ot::commissioner::Interpreter::Eval((Value *)local_4d0,&ctx.mInterpreter,&expr);
            bVar3 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_4d0);
            gtest_ar_.success_ = bVar3;
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            ot::commissioner::Interpreter::Value::~Value((Value *)local_4d0);
            if (gtest_ar_.success_ == false) {
              testing::Message::Message((Message *)&local_488);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_4d0,(internal *)&gtest_ar_,
                         (AssertionResult *)"ctx.mInterpreter.Eval(expr).HasNoError()","false",
                         "true",pcVar4);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_468,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                         ,0xc12,(char *)CONCAT44(local_4d0._4_4_,local_4d0._0_4_));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_468,(Message *)&local_488);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_468);
              std::__cxx11::string::~string((string *)local_4d0);
              if ((long *)local_488._M_unused._0_8_ != (long *)0x0) {
                (**(code **)(*local_488._M_unused._M_object + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            ot::commissioner::Interpreter::MultiNetCommandContext::Cleanup
                      ((MultiNetCommandContext *)&ctx);
            ot::commissioner::JobManager::CleanupJobs
                      (ctx.mInterpreter.mJobManager.
                       super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            std::__cxx11::string::string
                      ((string *)&gtest_ar_,"opdataset set active --import ",
                       (allocator *)local_468._M_pod_data);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_4d0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &gtest_ar_,&mepdsFileName);
            ot::commissioner::Interpreter::ParseExpression
                      ((Expression *)&local_488,&ctx.mInterpreter,(string *)local_4d0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_move_assign(&expr,&local_488);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_488);
            std::__cxx11::string::~string((string *)local_4d0);
            std::__cxx11::string::~string((string *)&gtest_ar_);
            ot::commissioner::Interpreter::Eval((Value *)local_4d0,&ctx.mInterpreter,&expr);
            ot::commissioner::Interpreter::Value::operator=(&value,(Value *)local_4d0);
            ot::commissioner::Interpreter::Value::~Value((Value *)local_4d0);
            bVar3 = ot::commissioner::Interpreter::Value::HasNoError(&value);
            gtest_ar_.success_ = bVar3;
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            if (!bVar3) {
              testing::Message::Message((Message *)&local_488);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_4d0,(internal *)&gtest_ar_,(AssertionResult *)0x27400f,
                         "false","true",pcVar4);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_468,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                         ,0xc18,(char *)CONCAT44(local_4d0._4_4_,local_4d0._0_4_));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_468,(Message *)&local_488);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_468);
              std::__cxx11::string::~string((string *)local_4d0);
              if ((long *)local_488._M_unused._0_8_ != (long *)0x0) {
                (**(code **)(*local_488._M_unused._M_object + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            unlink(mepdsFileName._M_dataplus._M_p);
            ot::commissioner::Interpreter::Value::~Value(&value);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&expr);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&commissionerAppMock.
                        super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          ot::commissioner::persistent_storage::BorderRouter::~BorderRouter(&br);
          goto LAB_001804d8;
        }
        testing::Message::Message((Message *)&br);
        if (commissionerAppMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          pp_Var5 = (commissionerAppMock.
                     super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi)->_vptr__Sp_counted_base;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&value,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0xc04,(char *)pp_Var5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&br);
        this_03 = (string *)
                  &commissionerAppMock.
                   super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
        if ((long *)CONCAT44(br._vptr_BorderRouter._4_4_,(ErrorCode)br._vptr_BorderRouter) !=
            (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(br._vptr_BorderRouter._4_4_,
                                         (ErrorCode)br._vptr_BorderRouter) + 8))();
        }
      }
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_03);
LAB_001804d8:
  std::__cxx11::string::~string((string *)&mepdsFileName);
  std::__cxx11::string::~string((string *)&multiEntryPendingDataset);
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, MNI_MultiEntryImportImplicitNetworkPass)
{
    TestContext ctx;
    InitContext(ctx);

    const std::string multiEntryPendingDataset = "\n\
{\n\
  \"1122334455667788\":\n\
  {\n\
    \"DelayTimer\": 60000, // in milliseconds\n\
    \"PendingTimestamp\": {\n\
        \"Seconds\": 58, // 48 bits\n\
        \"Ticks\": 48, // 15 bits\n\
        \"U\": 0 // 1 bit\n\
    },\n\
    \"ActiveTimestamp\": {\n\
        \"Seconds\": 58, // 48 bits\n\
        \"Ticks\": 48, // 15 bits\n\
        \"U\": 0 // 1 bit\n\
    },\n\
    \"ExtendedPanId\": \"1122334455667788\",\n\
    \"NetworkName\": \"net1\",\n\
    \"SecurityPolicy\": {\n\
        \"Flags\": \"ff\",\n\
        \"RotationTime\": 673\n\
    }\n\
  },\n\
  \"99AABBCCDDEEFF00\":\n\
  {\n\
    \"DelayTimer\": 60000, // in milliseconds\n\
    \"PendingTimestamp\": {\n\
        \"Seconds\": 58, // 48 bits\n\
        \"Ticks\": 48, // 15 bits\n\
        \"U\": 0 // 1 bit\n\
    },\n\
    \"ActiveTimestamp\": {\n\
        \"Seconds\": 58, // 48 bits\n\
        \"Ticks\": 48, // 15 bits\n\
        \"U\": 0 // 1 bit\n\
    },\n\
    \"ExtendedPanId\": \"99AABBCCDDEEFF00\",\n\
    \"NetworkName\": \"net9\",\n\
    \"SecurityPolicy\": {\n\
        \"Flags\": \"ff\",\n\
        \"RotationTime\": 673\n\
    }\n\
  }\n\
}";
    const std::string mepdsFileName            = "./mepds.json";
    ASSERT_EQ(WriteFile(multiEntryPendingDataset, mepdsFileName).GetCode(), ErrorCode::kNone);

    ASSERT_NE(ctx.mRegistry, nullptr);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 0x1122334455667788ul, "", "", Timestamp{0, 0, 0}, 0, "",
                                             ByteArray{}, "domain1", 0, 0, "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20002, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net2", 0x99AABBCCDDEEFF00ul, "", "", Timestamp{0, 0, 0}, 0, "",
                                             ByteArray{}, "domain2", 0, 0, "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    BorderRouter br;
    br.mNetworkId = 0;
    ASSERT_EQ(ctx.mRegistry->SetCurrentNetwork(br), RegistryStatus::kSuccess);

    CommissionerAppMockPtr commissionerAppMock{new CommissionerAppMock()};
    EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
        .WillOnce(
            DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = commissionerAppMock; }), Return(Error{})));
    EXPECT_CALL(*commissionerAppMock, SetActiveDataset(_)).WillOnce(Return(Error{}));
    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr = ctx.mInterpreter.ParseExpression("start");
    EXPECT_TRUE(ctx.mInterpreter.Eval(expr).HasNoError());
    ctx.mInterpreter.mContext.Cleanup();
    ctx.mInterpreter.mJobManager->CleanupJobs();

    expr  = ctx.mInterpreter.ParseExpression(std::string("opdataset set active --import ") + mepdsFileName);
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    unlink(mepdsFileName.c_str());
}